

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

BufferSp __thiscall
vkt::SpirVAssembly::getSpecializedBuffer<long>(SpirVAssembly *this,deInt64 number)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *pSVar3;
  long __tmp;
  BufferSp BVar4;
  vector<long,_std::allocator<long>_> local_30;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)operator_new(8);
  local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = number;
  *puVar1 = &PTR__Buffer_00cf5bf0;
  local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)(puVar1 + 1),&local_30);
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 **)this = puVar1;
  puVar2 = (undefined8 *)operator_new(0x20);
  *(undefined4 *)(puVar2 + 1) = 0;
  *(undefined4 *)((long)puVar2 + 0xc) = 0;
  *puVar2 = &PTR__SharedPtrState_00cf5c38;
  puVar2[2] = puVar1;
  *(undefined8 **)(this + 8) = puVar2;
  *(undefined4 *)(puVar2 + 1) = 1;
  *(undefined4 *)((long)puVar2 + 0xc) = 1;
  pSVar3 = extraout_RDX;
  if (local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (deInt64 *)0x0) {
    operator_delete(local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pSVar3 = extraout_RDX_00;
  }
  BVar4.m_state = pSVar3;
  BVar4.m_ptr = (BufferInterface *)this;
  return BVar4;
}

Assistant:

BufferSp getSpecializedBuffer (deInt64 number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, (T)number)));
}